

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BnB_JointTypeOrdering.cpp
# Opt level: O1

string * __thiscall
BGIP_BnB::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,BGIP_BnB *this,BnB_JointTypeOrdering type)

{
  long lVar1;
  
  lVar1 = ((ulong)this & 0xffffffff) * 0x20;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,
             *(long *)(BnB_JointTypeOrderingNames_abi_cxx11_ + lVar1),
             *(long *)(BnB_JointTypeOrderingNames_abi_cxx11_ + lVar1 + 8) +
             *(long *)(BnB_JointTypeOrderingNames_abi_cxx11_ + lVar1));
  return __return_storage_ptr__;
}

Assistant:

std::string BGIP_BnB::SoftPrint(BnB_JointTypeOrdering type)
{
    return BnB_JointTypeOrderingNames[type] ;
}